

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O3

string * __thiscall
front::irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
          (string *__return_storage_ptr__,irGenerator *this,TyKind kind)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
  *this_00;
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  PtrTy *this_02;
  element_type *__p;
  mapped_type *pmVar2;
  undefined1 auVar3 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  undefined1 local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  Variable local_88;
  string local_68;
  SharedTyPtr local_48;
  
  _Stack_b0._M_pi = local_b8;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_88.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ecf68;
  local_88.priority = 0;
  local_88.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_7_
       = 0;
  local_88._23_4_ = 0;
  if (kind == Ptr) {
    this_02 = (PtrTy *)operator_new(0x18);
    __p = (element_type *)operator_new(8);
    ((Displayable *)&(__p->super_Displayable)._vptr_Displayable)->_vptr_Displayable =
         (_func_int **)&PTR_display_001ecd58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
              (&_Stack_b0,(IntTy *)__p);
    local_48.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_b0._M_pi;
    local_48.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
    mir::types::PtrTy::PtrTy(this_02,&local_48);
    local_a8 = (undefined1  [8])this_02;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::PtrTy*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),this_02);
    this_03._M_pi = _Stack_a0._M_pi;
    auVar3 = local_a8;
    _local_a8 = (undefined1  [16])0x0;
    if (local_48.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  else {
    auVar3 = (undefined1  [8])(PtrTy *)0x0;
    this_03._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (kind == Int) {
      local_a8 = (undefined1  [8])operator_new(8);
      (((IntTy *)local_a8)->super_Ty).super_Displayable._vptr_Displayable =
           (_func_int **)&PTR_display_001ecd58;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::types::IntTy*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),(IntTy *)local_a8);
      auVar3 = local_a8;
      this_03._M_pi = _Stack_a0._M_pi;
    }
  }
  this_00 = &this->_funcNameToFuncData;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](this_00,(this->_funcStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
  getTmpName_abi_cxx11_((string *)local_a8,this,pmVar2->_nowTmpId);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_a8);
  if (local_a8 != (undefined1  [8])&local_98) {
    operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
  }
  if (this_03._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_03._M_pi)->_M_use_count = (this_03._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_03._M_pi)->_M_use_count = (this_03._M_pi)->_M_use_count + 1;
        UNLOCK();
        goto LAB_00183160;
      }
    }
    else {
      (this_03._M_pi)->_M_use_count = (this_03._M_pi)->_M_use_count + 1;
    }
    (this_03._M_pi)->_M_use_count = (this_03._M_pi)->_M_use_count + 1;
  }
LAB_00183160:
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT17(local_88.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._7_1_,
                     local_88.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._0_7_);
  local_88.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_7_
       = SUB87(this_03._M_pi,0);
  local_88.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
       = (undefined1)((ulong)this_03._M_pi >> 0x38);
  local_88.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar3;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  local_88._24_3_ = 0x100;
  local_88._27_1_ = 0;
  local_88.priority = 0;
  if (this_03._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
  }
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](this_00,(this->_funcStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
  insertLocalValue(this,&local_68,pmVar2->_nowTmpId,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](this_00,(this->_funcStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
  pmVar2->_nowTmpId = pmVar2->_nowTmpId + 1;
  if (this_03._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

string irGenerator::getNewTmpValueName(TyKind kind) {
  SharedTyPtr ty;
  string name;
  Variable variable;

  switch (kind) {
    case mir::types::TyKind::Int:
      ty = shared_ptr<IntTy>(new IntTy());
      break;
    case mir::types::TyKind::Ptr:
      ty = shared_ptr<PtrTy>(new PtrTy(shared_ptr<IntTy>(new IntTy())));
      break;
    default:
      break;
  }

  name = getTmpName(_funcNameToFuncData[_funcStack.back()]._nowTmpId);
  variable = Variable(ty, false, true);
  insertLocalValue(name, _funcNameToFuncData[_funcStack.back()]._nowTmpId,
                   variable);
  _funcNameToFuncData[_funcStack.back()]._nowTmpId++;
  ;
  return name;
}